

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitLoad(I64ToI32Lowering *this,Load *curr)

{
  bool bVar1;
  uint uVar2;
  Builder *pBVar3;
  Builder *pBVar4;
  size_t sVar5;
  char *pcVar6;
  byte bVar7;
  Index IVar8;
  Index IVar9;
  LocalSet *any;
  LocalGet *pLVar10;
  Load *value;
  LocalSet *args;
  Const *right;
  Binary *value_00;
  LocalSet *append;
  Block *expression;
  address64_t aVar11;
  address64_t aVar12;
  undefined1 local_c8 [8];
  TempVar lowBits;
  TempVar highBits;
  TempVar ptrTemp;
  
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id == 3) {
    if (curr->isAtomic == true) {
      __assert_fail("!curr->isAtomic && \"64-bit atomic load not implemented\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                    ,0x17b,"void wasm::I64ToI32Lowering::visitLoad(Load *)");
    }
    getTemp((TempVar *)local_c8,this,(Type)0x2);
    getTemp((TempVar *)&lowBits.ty,this,(Type)0x2);
    getTemp((TempVar *)&highBits.ty,this,(Type)0x2);
    pBVar3 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar8 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
    any = Builder::makeLocalSet(pBVar3,IVar8,curr->ptr);
    if (curr->bytes == '\b') {
      pBVar3 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar8 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowBits.ty);
      pBVar4 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      bVar1 = curr->signed_;
      aVar12 = (curr->offset).addr;
      uVar2 = (uint)(curr->align).addr;
      aVar11 = (address64_t)uVar2;
      if (3 < uVar2) {
        aVar11 = 4;
      }
      IVar9 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
      pLVar10 = Builder::makeLocalGet(pBVar4,IVar9,(Type)0x2);
      sVar5 = (curr->memory).super_IString.str._M_len;
      pcVar6 = (curr->memory).super_IString.str._M_str;
      value = MixedArena::alloc<wasm::Load>(&pBVar4->wasm->allocator);
      value->isAtomic = false;
      value->bytes = '\x04';
      value->signed_ = bVar1;
      (value->offset).addr = aVar12 + 4;
      (value->align).addr = aVar11;
      value->ptr = (Expression *)pLVar10;
      (value->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
      (value->memory).super_IString.str._M_len = sVar5;
      (value->memory).super_IString.str._M_str = pcVar6;
      args = Builder::makeLocalSet(pBVar3,IVar8,(Expression *)value);
    }
    else {
      bVar1 = curr->signed_;
      pBVar3 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      IVar8 = TempVar::operator_cast_to_unsigned_int((TempVar *)&lowBits.ty);
      pBVar4 = (this->builder)._M_t.
               super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
               super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      if (bVar1 == true) {
        IVar9 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_c8);
        pLVar10 = Builder::makeLocalGet(pBVar4,IVar9,(Type)0x2);
        right = Builder::makeConst<int>
                          ((this->builder)._M_t.
                           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                           .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
        value_00 = Builder::makeBinary(pBVar4,ShrSInt32,(Expression *)pLVar10,(Expression *)right);
      }
      else {
        value_00 = (Binary *)Builder::makeConst<int>(pBVar4,0);
      }
      args = Builder::makeLocalSet(pBVar3,IVar8,(Expression *)value_00);
    }
    (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id = 2;
    bVar7 = curr->bytes;
    if (3 < bVar7) {
      bVar7 = 4;
    }
    curr->bytes = bVar7;
    uVar2 = (uint)(curr->align).addr;
    aVar12 = 4;
    if (uVar2 < 4) {
      aVar12 = (address64_t)uVar2;
    }
    (curr->align).addr = aVar12;
    pBVar3 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar8 = TempVar::operator_cast_to_unsigned_int((TempVar *)&highBits.ty);
    pLVar10 = Builder::makeLocalGet(pBVar3,IVar8,(Type)0x2);
    curr->ptr = (Expression *)pLVar10;
    pBVar3 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar8 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_c8);
    append = Builder::makeLocalSet(pBVar3,IVar8,(Expression *)curr);
    pBVar4 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar8 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_c8);
    pLVar10 = Builder::makeLocalGet(pBVar4,IVar8,(Type)0x2);
    expression = Builder::blockify<wasm::LocalSet*,wasm::LocalGet*>
                           (pBVar3,(Expression *)any,(Expression *)append,args,pLVar10);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)expression);
    setOutParam(this,(Expression *)expression,(TempVar *)&lowBits.ty);
    TempVar::~TempVar((TempVar *)&highBits.ty);
    TempVar::~TempVar((TempVar *)&lowBits.ty);
    TempVar::~TempVar((TempVar *)local_c8);
  }
  return;
}

Assistant:

void visitLoad(Load* curr) {
    if (curr->type != Type::i64) {
      return;
    }
    assert(!curr->isAtomic && "64-bit atomic load not implemented");
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    TempVar ptrTemp = getTemp();
    LocalSet* setPtr = builder->makeLocalSet(ptrTemp, curr->ptr);
    LocalSet* loadHigh;
    if (curr->bytes == 8) {
      loadHigh = builder->makeLocalSet(
        highBits,
        builder->makeLoad(4,
                          curr->signed_,
                          curr->offset + 4,
                          std::min(uint32_t(curr->align), uint32_t(4)),
                          builder->makeLocalGet(ptrTemp, Type::i32),
                          Type::i32,
                          curr->memory));
    } else if (curr->signed_) {
      loadHigh = builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShrSInt32,
                            builder->makeLocalGet(lowBits, Type::i32),
                            builder->makeConst(int32_t(31))));
    } else {
      loadHigh =
        builder->makeLocalSet(highBits, builder->makeConst(int32_t(0)));
    }
    curr->type = Type::i32;
    curr->bytes = std::min(curr->bytes, uint8_t(4));
    curr->align = std::min(uint32_t(curr->align), uint32_t(4));
    curr->ptr = builder->makeLocalGet(ptrTemp, Type::i32);
    Block* result =
      builder->blockify(setPtr,
                        builder->makeLocalSet(lowBits, curr),
                        loadHigh,
                        builder->makeLocalGet(lowBits, Type::i32));
    replaceCurrent(result);
    setOutParam(result, std::move(highBits));
  }